

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOPofR.cpp
# Opt level: O3

void __thiscall OpenMD::IcosahedralOfR::writeOrderParameter(IcosahedralOfR *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  char cVar4;
  ostream *poVar5;
  ulong uVar6;
  Revision rev;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  ofstream osw;
  ofstream osq;
  Revision local_451;
  string local_450;
  undefined1 local_430 [8];
  size_type local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420 [14];
  ios_base aiStack_338 [264];
  pointer local_230;
  filebuf local_228 [240];
  ios_base aiStack_138 [264];
  
  pcVar2 = (this->super_BOPofR).super_StaticAnalyser.outputFilename_._M_dataplus._M_p;
  local_430 = (undefined1  [8])local_420;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_430,pcVar2,
             pcVar2 + (this->super_BOPofR).super_StaticAnalyser.outputFilename_._M_string_length);
  std::__cxx11::string::append((char *)local_430);
  std::ofstream::ofstream(&local_230,(char *)local_430,_S_out);
  if (local_430 != (undefined1  [8])local_420) {
    operator_delete((void *)local_430,local_420[0]._M_allocated_capacity + 1);
  }
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    pcVar2 = (this->super_BOPofR).super_StaticAnalyser.outputFilename_._M_dataplus._M_p;
    local_430 = (undefined1  [8])local_420;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_430,pcVar2,
               pcVar2 + (this->super_BOPofR).super_StaticAnalyser.outputFilename_._M_string_length);
    std::__cxx11::string::append(local_430);
    snprintf(painCave.errMsg,2000,"IcosahedralOfR: unable to open %s\n",local_430);
    if (local_430 != (undefined1  [8])local_420) {
      operator_delete((void *)local_430,local_420[0]._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# ",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,
                        (this->super_BOPofR).super_StaticAnalyser.analysisType_._M_dataplus._M_p,
                        (this->super_BOPofR).super_StaticAnalyser.analysisType_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# OpenMD ",9);
    Revision::getFullRevision_abi_cxx11_((string *)local_430,&local_451);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(char *)local_430,local_428);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if (local_430 != (undefined1  [8])local_420) {
      operator_delete((void *)local_430,local_420[0]._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# ",2);
    Revision::getBuildDate_abi_cxx11_((string *)local_430,&local_451);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(char *)local_430,local_428);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if (local_430 != (undefined1  [8])local_420) {
      operator_delete((void *)local_430,local_420[0]._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"# selection script: \"",0x15);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->super_BOPofR).selectionScript_._M_dataplus._M_p
                        ,(this->super_BOPofR).selectionScript_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
    if ((this->super_BOPofR).super_StaticAnalyser.paramString_._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# parameters: ",0xe)
      ;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,
                          (this->super_BOPofR).super_StaticAnalyser.paramString_._M_dataplus._M_p,
                          (this->super_BOPofR).super_StaticAnalyser.paramString_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    }
    if ((this->super_BOPofR).super_StaticAnalyser.nBins_ != 0) {
      uVar6 = 0;
      do {
        std::ostream::_M_insert<double>
                  (((double)(uVar6 & 0xffffffff) + 0.5) * (this->super_BOPofR).deltaR_);
        if ((this->super_BOPofR).RCount_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6] == 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
          std::ostream::operator<<((ostream *)&local_230,0);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
          std::ostream::_M_insert<double>
                    ((double)(this->super_BOPofR).QofR_.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar6] /
                     (double)(this->super_BOPofR).RCount_.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar6]);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
        uVar6 = uVar6 + 1;
      } while (uVar6 < (this->super_BOPofR).super_StaticAnalyser.nBins_);
    }
    std::ofstream::close();
  }
  paVar1 = &local_450.field_2;
  pcVar2 = (this->super_BOPofR).super_StaticAnalyser.outputFilename_._M_dataplus._M_p;
  local_450._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_450,pcVar2,
             pcVar2 + (this->super_BOPofR).super_StaticAnalyser.outputFilename_._M_string_length);
  std::__cxx11::string::append((char *)&local_450);
  std::ofstream::ofstream(local_430,local_450._M_dataplus._M_p,_S_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != paVar1) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    pcVar2 = (this->super_BOPofR).super_StaticAnalyser.outputFilename_._M_dataplus._M_p;
    local_450._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_450,pcVar2,
               pcVar2 + (this->super_BOPofR).super_StaticAnalyser.outputFilename_._M_string_length);
    std::__cxx11::string::append((char *)&local_450);
    snprintf(painCave.errMsg,2000,"IcosahedralOfR: unable to open %s\n",local_450._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != paVar1) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_430,"# ",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_430,
                        (this->super_BOPofR).super_StaticAnalyser.analysisType_._M_dataplus._M_p,
                        (this->super_BOPofR).super_StaticAnalyser.analysisType_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_430,"# OpenMD ",9);
    Revision::getFullRevision_abi_cxx11_(&local_450,&local_451);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_430,local_450._M_dataplus._M_p,local_450._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != paVar1) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_430,"# ",2);
    Revision::getBuildDate_abi_cxx11_(&local_450,&local_451);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_430,local_450._M_dataplus._M_p,local_450._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != paVar1) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_430,"# selection script: \"",0x15);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_430,(this->super_BOPofR).selectionScript_._M_dataplus._M_p,
                        (this->super_BOPofR).selectionScript_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
    if ((this->super_BOPofR).super_StaticAnalyser.paramString_._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_430,"# parameters: ",0xe);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_430,
                          (this->super_BOPofR).super_StaticAnalyser.paramString_._M_dataplus._M_p,
                          (this->super_BOPofR).super_StaticAnalyser.paramString_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    }
    if ((this->super_BOPofR).super_StaticAnalyser.nBins_ != 0) {
      uVar6 = 0;
      do {
        std::ostream::_M_insert<double>
                  (((double)(uVar6 & 0xffffffff) + 0.5) * (this->super_BOPofR).deltaR_);
        if ((this->super_BOPofR).RCount_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6] == 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_430,"\t",1);
          std::ostream::operator<<((ostream *)local_430,0);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_430,"\t",1);
          std::ostream::_M_insert<double>
                    ((double)(this->super_BOPofR).WofR_.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar6] /
                     (double)(this->super_BOPofR).RCount_.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar6]);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_430,"\n",1);
        uVar6 = uVar6 + 1;
      } while (uVar6 < (this->super_BOPofR).super_StaticAnalyser.nBins_);
    }
    std::ofstream::close();
  }
  uVar3 = ___throw_bad_array_new_length;
  pcVar2 = _VTT;
  local_430 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_430 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&local_428);
  std::ios_base::~ios_base(aiStack_338);
  local_230 = pcVar2;
  *(undefined8 *)(local_228 + *(long *)(pcVar2 + -0x18) + -8) = uVar3;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(aiStack_138);
  return;
}

Assistant:

void IcosahedralOfR::writeOrderParameter() {
    Revision rev;
    std::ofstream osq((getOutputFileName() + "qr").c_str());

    if (osq.is_open()) {
      osq << "# " << getAnalysisType() << "\n";
      osq << "# OpenMD " << rev.getFullRevision() << "\n";
      osq << "# " << rev.getBuildDate() << "\n";
      osq << "# selection script: \"" << selectionScript_ << "\"\n";
      if (!paramString_.empty())
        osq << "# parameters: " << paramString_ << "\n";

      // Normalize by number of frames and write it out:

      for (unsigned int i = 0; i < nBins_; ++i) {
        RealType Rval = (i + 0.5) * deltaR_;
        osq << Rval;
        if (RCount_[i] == 0) {
          osq << "\t" << 0;
          osq << "\n";
        } else {
          osq << "\t" << (RealType)QofR_[i] / (RealType)RCount_[i];
          osq << "\n";
        }
      }

      osq.close();

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "IcosahedralOfR: unable to open %s\n",
               (getOutputFileName() + "q").c_str());
      painCave.isFatal = 1;
      simError();
    }

    std::ofstream osw((getOutputFileName() + "wr").c_str());

    if (osw.is_open()) {
      osw << "# " << getAnalysisType() << "\n";
      osw << "# OpenMD " << rev.getFullRevision() << "\n";
      osw << "# " << rev.getBuildDate() << "\n";
      osw << "# selection script: \"" << selectionScript_ << "\"\n";
      if (!paramString_.empty())
        osw << "# parameters: " << paramString_ << "\n";

      // Normalize by number of frames and write it out:
      for (unsigned int i = 0; i < nBins_; ++i) {
        RealType Rval = deltaR_ * (i + 0.5);
        osw << Rval;
        if (RCount_[i] == 0) {
          osw << "\t" << 0;
          osw << "\n";
        } else {
          osw << "\t" << (RealType)WofR_[i] / (RealType)RCount_[i];
          osw << "\n";
        }
      }

      osw.close();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "IcosahedralOfR: unable to open %s\n",
               (getOutputFileName() + "w").c_str());
      painCave.isFatal = 1;
      simError();
    }
  }